

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  byte *__src;
  LZ4_byte *pLVar12;
  ushort *puVar13;
  byte *pbVar14;
  uint uVar15;
  ulong uVar16;
  ushort *puVar17;
  long lVar18;
  byte *pbVar19;
  ulong uVar20;
  byte *pbVar21;
  byte *pbVar22;
  BYTE *s;
  ushort *puVar23;
  ushort *puVar24;
  BYTE *d;
  ulong uVar25;
  BYTE *d_1;
  byte *pbVar26;
  byte *pbVar27;
  byte *local_b8;
  int local_88;
  int local_78;
  byte *local_38;
  
  uVar20 = (LZ4_streamDecode->internal_donotuse).prefixSize;
  if (uVar20 == 0) {
    uVar15 = LZ4_decompress_safe(source,dest,compressedSize,maxOutputSize);
  }
  else {
    if ((LZ4_streamDecode->internal_donotuse).prefixEnd == (LZ4_byte *)dest) {
      if (uVar20 < 0xffff) {
        uVar5 = LZ4_streamDecode->table[1];
        if (uVar5 != 0) {
          puVar23 = (ushort *)0xffffffff;
          if (source != (char *)0x0) {
            pLVar12 = (LZ4_streamDecode->internal_donotuse).externalDict + uVar5;
            if ((LZ4_streamDecode->internal_donotuse).externalDict == (LZ4_byte *)0x0) {
              pLVar12 = (LZ4_byte *)0x0;
            }
            if (maxOutputSize == 0) {
              if (compressedSize == 1) {
                puVar23 = (ushort *)(ulong)-(uint)(*source != '\0');
              }
            }
            else if (compressedSize != 0) {
              __src = (byte *)(dest + -uVar20);
              puVar1 = (ushort *)(source + compressedSize);
              pbVar2 = (byte *)(dest + maxOutputSize);
              puVar23 = (ushort *)source;
              pbVar27 = (byte *)dest;
              if (maxOutputSize < 0x40) goto LAB_00142014;
              puVar13 = (ushort *)((long)puVar1 - 0xf);
              puVar17 = (ushort *)source;
LAB_00141878:
              bVar4 = (byte)*puVar17;
              uVar15 = (uint)bVar4;
              puVar24 = (ushort *)((long)puVar17 + 1);
              uVar20 = (ulong)(uint)(bVar4 >> 4);
              puVar23 = puVar24;
              if (bVar4 >> 4 == 0xf) {
                if (puVar24 < puVar13) {
                  uVar10 = 0;
                  do {
                    uVar7 = *puVar23;
                    puVar23 = (ushort *)((long)puVar23 + 1);
                    uVar10 = uVar10 + (byte)uVar7;
                  } while (puVar23 < puVar13 && (byte)uVar7 == 0xff);
                  uVar20 = (ulong)uVar10 + 0xf;
                }
                else {
                  uVar20 = 0xf;
                }
                pbVar26 = pbVar27 + uVar20;
                iVar11 = 5;
                if ((((puVar24 < puVar13) && (!CARRY8((ulong)pbVar27,uVar20))) &&
                    (!CARRY8((ulong)puVar23,uVar20))) &&
                   ((iVar11 = 6, local_b8 = pbVar26, pbVar26 <= pbVar2 + -0x20 &&
                    ((ushort *)((long)puVar23 + uVar20) <= puVar1 + -0x10)))) {
                  lVar18 = 0;
                  do {
                    uVar6 = *(undefined8 *)((byte *)((long)puVar23 + lVar18) + 8);
                    pbVar21 = pbVar27 + lVar18;
                    *(undefined8 *)pbVar21 = *(undefined8 *)((long)puVar23 + lVar18);
                    *(undefined8 *)(pbVar21 + 8) = uVar6;
                    pbVar3 = (byte *)((long)puVar23 + lVar18 + 0x10);
                    uVar6 = *(undefined8 *)(pbVar3 + 8);
                    *(undefined8 *)(pbVar21 + 0x10) = *(undefined8 *)pbVar3;
                    *(undefined8 *)(pbVar21 + 0x18) = uVar6;
                    lVar18 = lVar18 + 0x20;
                  } while (pbVar21 + 0x20 < pbVar26);
                  iVar11 = 0;
                  puVar23 = (ushort *)((long)puVar23 + uVar20);
                  pbVar27 = pbVar26;
                }
                pbVar26 = pbVar27;
                if (iVar11 != 0) {
                  if (iVar11 != 5) {
                    if (iVar11 == 6) goto LAB_00141e4d;
                    goto LAB_00141d27;
                  }
                  goto LAB_001420be;
                }
              }
              else {
                local_b8 = pbVar27 + uVar20;
                if ((ushort *)((long)puVar1 - 0x11U) < puVar24) goto LAB_00141e4d;
                uVar6 = *(undefined8 *)((long)puVar17 + 9);
                *(undefined8 *)pbVar27 = *(undefined8 *)puVar24;
                *(undefined8 *)(pbVar27 + 8) = uVar6;
                puVar23 = (ushort *)(uVar20 + (long)puVar24);
                pbVar26 = local_b8;
              }
              uVar7 = *puVar23;
              uVar25 = (ulong)uVar7;
              puVar23 = puVar23 + 1;
              pbVar21 = pbVar26 + -uVar25;
              uVar20 = (ulong)(bVar4 & 0xf);
              if (uVar20 == 0xf) {
                iVar11 = 5;
                if ((uVar5 < 0x10000) && (pbVar21 + uVar5 < __src)) {
                  uVar16 = 0xf;
                }
                else {
                  uVar15 = 0;
                  do {
                    uVar8 = *puVar23;
                    puVar23 = (ushort *)((long)puVar23 + 1);
                    uVar15 = uVar15 + (byte)uVar8;
                  } while ((byte)uVar8 == 0xff && puVar23 < puVar1 + -2);
                  uVar20 = (ulong)uVar15;
                  uVar16 = uVar20 + 0xf;
                  if ((puVar23 < puVar1 + -2) && (!CARRY8((ulong)pbVar26,uVar16))) {
                    uVar16 = uVar20 + 0x13;
                    iVar11 = 7;
                    if (pbVar26 + uVar20 + 0x13 < pbVar2 + -0x40) {
                      iVar11 = 0;
                    }
                  }
                }
                if (iVar11 != 0) {
                  if (iVar11 != 5) {
                    if (iVar11 == 7) goto LAB_00141ef3;
                    goto LAB_00141d27;
                  }
                  goto LAB_001420be;
                }
              }
              else {
                uVar16 = uVar20 + 4;
                if (pbVar2 + -0x40 <= pbVar26 + uVar20 + 4) goto LAB_00141ef3;
                if ((__src <= pbVar21) && (7 < uVar7)) {
                  *(undefined8 *)pbVar26 = *(undefined8 *)pbVar21;
                  *(undefined8 *)(pbVar26 + 8) = *(undefined8 *)(pbVar21 + 8);
                  *(undefined2 *)(pbVar26 + 0x10) = *(undefined2 *)(pbVar21 + 0x10);
                  puVar17 = puVar23;
                  pbVar27 = pbVar26 + uVar20 + 4;
                  goto LAB_00141878;
                }
              }
              if ((uVar5 < 0x10000) && (pbVar21 + uVar5 < __src)) goto LAB_001420be;
              pbVar3 = pbVar26 + uVar16;
              puVar17 = puVar23;
              pbVar27 = pbVar3;
              if (__src <= pbVar21) {
                local_b8 = pbVar3;
                if (0xf < uVar7) {
                  do {
                    uVar6 = *(undefined8 *)(pbVar26 + -uVar25 + 8);
                    *(undefined8 *)pbVar26 = *(undefined8 *)(pbVar26 + -uVar25);
                    *(undefined8 *)(pbVar26 + 8) = uVar6;
                    uVar6 = *(undefined8 *)(pbVar26 + -uVar25 + 0x10 + 8);
                    *(undefined8 *)(pbVar26 + 0x10) = *(undefined8 *)(pbVar26 + -uVar25 + 0x10);
                    *(undefined8 *)(pbVar26 + 0x18) = uVar6;
                    pbVar26 = pbVar26 + 0x20;
                  } while (pbVar26 < pbVar3);
                  goto LAB_00141878;
                }
                if (uVar25 == 4) {
                  iVar11 = *(int *)pbVar21;
                }
                else if (uVar7 == 2) {
                  iVar11 = CONCAT22(*(undefined2 *)pbVar21,*(undefined2 *)pbVar21);
                }
                else {
                  if (uVar7 != 1) {
                    if (uVar7 < 8) {
                      pbVar26[0] = 0;
                      pbVar26[1] = 0;
                      pbVar26[2] = 0;
                      pbVar26[3] = 0;
                      *pbVar26 = *pbVar21;
                      pbVar26[1] = pbVar21[1];
                      pbVar26[2] = pbVar21[2];
                      pbVar26[3] = pbVar21[3];
                      uVar15 = inc32table[uVar7];
                      *(undefined4 *)(pbVar26 + 4) = *(undefined4 *)(pbVar21 + uVar15);
                      pbVar21 = pbVar21 + ((ulong)uVar15 - (long)dec64table[uVar7]);
                    }
                    else {
                      *(undefined8 *)pbVar26 = *(undefined8 *)pbVar21;
                      pbVar21 = pbVar21 + 8;
                    }
                    pbVar26 = pbVar26 + 8;
                    do {
                      *(undefined8 *)pbVar26 = *(undefined8 *)pbVar21;
                      pbVar26 = pbVar26 + 8;
                      pbVar21 = pbVar21 + 8;
                    } while (pbVar26 < pbVar3);
                    goto LAB_00141878;
                  }
                  iVar11 = (uint)*pbVar21 * 0x1010101;
                }
                *(int *)pbVar26 = iVar11;
                *(int *)(pbVar26 + 4) = iVar11;
                if (8 < uVar16) {
                  pbVar26 = pbVar26 + 8;
                  do {
                    *(int *)pbVar26 = iVar11;
                    *(int *)(pbVar26 + 4) = iVar11;
                    pbVar26 = pbVar26 + 8;
                  } while (pbVar26 < pbVar3);
                }
                goto LAB_00141878;
              }
              if (pbVar2 + -5 < pbVar3) goto LAB_001420be;
              uVar20 = (long)__src - (long)pbVar21;
              uVar25 = uVar16 - uVar20;
              if (uVar16 < uVar20 || uVar25 == 0) {
                memmove(pbVar26,pLVar12 + -uVar20,uVar16);
              }
              else {
                memcpy(pbVar26,pLVar12 + -uVar20,uVar20);
                pbVar27 = pbVar26 + uVar20;
                if ((ulong)((long)pbVar27 - (long)__src) < uVar25) {
                  pbVar26 = __src;
                  if ((long)uVar20 < (long)uVar16) {
                    do {
                      *pbVar27 = *pbVar26;
                      pbVar27 = pbVar27 + 1;
                      pbVar26 = pbVar26 + 1;
                    } while (pbVar27 < pbVar3);
                  }
                }
                else {
                  memcpy(pbVar27,__src,uVar25);
                  pbVar27 = pbVar3;
                }
              }
              goto LAB_00141878;
            }
          }
          goto LAB_00141d27;
        }
        uVar15 = LZ4_decompress_safe_withSmallPrefix
                           (source,dest,compressedSize,maxOutputSize,uVar20);
      }
      else {
        uVar15 = LZ4_decompress_safe_withPrefix64k(source,dest,compressedSize,maxOutputSize);
      }
      puVar23 = (ushort *)(ulong)uVar15;
      goto LAB_00141d27;
    }
    (LZ4_streamDecode->internal_donotuse).extDictSize = uVar20;
    pLVar12 = (LZ4_streamDecode->internal_donotuse).prefixEnd + -uVar20;
    (LZ4_streamDecode->internal_donotuse).externalDict = pLVar12;
    uVar15 = LZ4_decompress_safe_forceExtDict
                       (source,dest,compressedSize,maxOutputSize,pLVar12,uVar20);
  }
  if ((int)uVar15 < 1) {
    return uVar15;
  }
  LZ4_streamDecode->table[3] = (ulong)uVar15;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dest + uVar15);
  return uVar15;
LAB_00141ef3:
  if ((uVar5 < 0x10000) && (pbVar21 + uVar5 < __src)) goto LAB_001420be;
  pbVar3 = pbVar26 + uVar16;
  pbVar27 = pbVar3;
  if (pbVar21 < __src) {
    if (pbVar2 + -5 < pbVar3) goto LAB_001420be;
    uVar20 = (long)__src - (long)pbVar21;
    uVar25 = uVar16 - uVar20;
    if (uVar16 < uVar20 || uVar25 == 0) {
      memmove(pbVar26,pLVar12 + -uVar20,uVar16);
    }
    else {
      memcpy(pbVar26,pLVar12 + -uVar20,uVar20);
      pbVar27 = pbVar26 + uVar20;
      if ((ulong)((long)pbVar27 - (long)__src) < uVar25) {
        pbVar26 = __src;
        if ((long)uVar20 < (long)uVar16) {
          do {
            *pbVar27 = *pbVar26;
            pbVar27 = pbVar27 + 1;
            pbVar26 = pbVar26 + 1;
          } while (pbVar27 < pbVar3);
        }
      }
      else {
        memcpy(pbVar27,__src,uVar25);
        pbVar27 = pbVar3;
      }
    }
  }
  else {
    if ((uint)uVar25 < 8) {
      LZ4_decompress_safe_continue_cold_1();
      pbVar21 = local_38;
    }
    else {
      *(undefined8 *)pbVar26 = *(undefined8 *)pbVar21;
      pbVar21 = pbVar21 + 8;
    }
    pbVar14 = pbVar26 + 8;
    if (pbVar2 + -0xc < pbVar3) {
      iVar11 = 5;
      if (pbVar3 <= pbVar2 + -5) {
        pbVar26 = pbVar2 + -7;
        pbVar19 = pbVar21;
        pbVar22 = pbVar14;
        if (pbVar14 < pbVar26) {
          do {
            *(undefined8 *)pbVar22 = *(undefined8 *)pbVar19;
            pbVar22 = pbVar22 + 8;
            pbVar19 = pbVar19 + 8;
          } while (pbVar22 < pbVar26);
          pbVar21 = pbVar21 + ((long)pbVar26 - (long)pbVar14);
          pbVar14 = pbVar26;
        }
        iVar11 = 0;
        for (; pbVar14 < pbVar3; pbVar14 = pbVar14 + 1) {
          bVar4 = *pbVar21;
          pbVar21 = pbVar21 + 1;
          *pbVar14 = bVar4;
        }
      }
      if (iVar11 != 0) {
        if (iVar11 != 5) goto LAB_00141d27;
        goto LAB_001420be;
      }
    }
    else {
      *(undefined8 *)pbVar14 = *(undefined8 *)pbVar21;
      if (0x10 < uVar16) {
        pbVar26 = pbVar26 + 0x10;
        do {
          pbVar21 = pbVar21 + 8;
          *(undefined8 *)pbVar26 = *(undefined8 *)pbVar21;
          pbVar26 = pbVar26 + 8;
        } while (pbVar26 < pbVar3);
      }
    }
  }
LAB_00142014:
  bVar4 = (byte)*puVar23;
  puVar13 = (ushort *)((long)puVar23 + 1);
  while( true ) {
    uVar15 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar20 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar13) ||
       (dest + (long)maxOutputSize + -0x20 < pbVar27)) goto LAB_00141e49;
    uVar6 = *(undefined8 *)(puVar13 + 4);
    *(undefined8 *)pbVar27 = *(undefined8 *)puVar13;
    *(undefined8 *)(pbVar27 + 8) = uVar6;
    local_b8 = pbVar27 + uVar20;
    uVar16 = (ulong)(uVar15 & 0xf);
    puVar17 = (ushort *)((long)puVar13 + uVar20);
    uVar25 = (ulong)*puVar17;
    pbVar21 = local_b8 + -uVar25;
    if ((((uVar15 & 0xf) == 0xf) || (*puVar17 < 8)) || (pbVar21 < __src)) goto LAB_00141e97;
    *(undefined8 *)local_b8 = *(undefined8 *)pbVar21;
    *(undefined8 *)(local_b8 + 8) = *(undefined8 *)(pbVar21 + 8);
    *(undefined2 *)(local_b8 + 0x10) = *(undefined2 *)(pbVar21 + 0x10);
    pbVar27 = local_b8 + uVar16 + 4;
    bVar4 = *(byte *)((long)puVar13 + uVar20 + 2);
    puVar13 = (ushort *)((long)puVar13 + uVar20 + 3);
  }
  puVar17 = (ushort *)((long)puVar1 - 0xf);
  uVar20 = 0xf;
  puVar23 = puVar13;
  if (puVar13 < puVar17) {
    uVar10 = 0;
    do {
      uVar7 = *puVar23;
      puVar23 = (ushort *)((long)puVar23 + 1);
      uVar10 = uVar10 + (byte)uVar7;
    } while (puVar23 < puVar17 && (byte)uVar7 == 0xff);
    uVar20 = (ulong)uVar10 + 0xf;
  }
  if (((puVar17 <= puVar13) || (CARRY8((ulong)pbVar27,uVar20))) ||
     (puVar13 = puVar23, CARRY8((ulong)puVar23,uVar20))) goto LAB_001420be;
LAB_00141e49:
  local_b8 = pbVar27 + uVar20;
  puVar23 = puVar13;
LAB_00141e4d:
  puVar17 = (ushort *)(uVar20 + (long)puVar23);
  if ((pbVar2 + -0xc < local_b8) || (puVar1 + -4 < puVar17)) {
    if ((puVar17 != puVar1) || (pbVar2 < local_b8)) goto LAB_001420be;
    memmove(pbVar27,puVar23,uVar20);
    local_78 = (int)dest;
    puVar23 = (ushort *)(ulong)(uint)(((int)pbVar27 + (int)uVar20) - local_78);
    goto LAB_00141d27;
  }
  do {
    *(undefined8 *)pbVar27 = *(undefined8 *)puVar23;
    pbVar27 = pbVar27 + 8;
    puVar23 = puVar23 + 4;
  } while (pbVar27 < local_b8);
  uVar25 = (ulong)*puVar17;
  pbVar21 = local_b8 + -uVar25;
  uVar16 = (ulong)(uVar15 & 0xf);
LAB_00141e97:
  puVar23 = puVar17 + 1;
  if ((int)uVar16 == 0xf) {
    uVar15 = 0;
    do {
      uVar7 = *puVar23;
      puVar23 = (ushort *)((long)puVar23 + 1);
      uVar15 = uVar15 + (byte)uVar7;
    } while (puVar23 < puVar1 + -2 && (byte)uVar7 == 0xff);
    uVar16 = (ulong)uVar15 + 0xf;
    cVar9 = '\x05';
    if (puVar23 < puVar1 + -2) {
      cVar9 = CARRY8((ulong)local_b8,uVar16) * '\x05';
    }
    if (cVar9 != '\0') goto LAB_0014203c;
  }
  uVar16 = uVar16 + 4;
  pbVar26 = local_b8;
  goto LAB_00141ef3;
LAB_0014203c:
  if (cVar9 == '\x05') {
LAB_001420be:
    local_88 = (int)source;
    puVar23 = (ushort *)(ulong)(~(uint)puVar23 + local_88);
  }
LAB_00141d27:
  if (0 < (int)puVar23) {
    LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + ((ulong)puVar23 & 0xffffffff);
    (LZ4_streamDecode->internal_donotuse).prefixEnd =
         (LZ4_streamDecode->internal_donotuse).prefixEnd + ((ulong)puVar23 & 0xffffffff);
  }
  return (int)puVar23;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    int result;

    if (lz4sd->prefixSize == 0) {
        /* The first call, no dictionary yet. */
        assert(lz4sd->extDictSize == 0);
        result = LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd = (BYTE*)dest + result;
    } else if (lz4sd->prefixEnd == (BYTE*)dest) {
        /* They're rolling the current segment. */
        if (lz4sd->prefixSize >= 64 KB - 1)
            result = LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        else if (lz4sd->extDictSize == 0)
            result = LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize,
                                                         lz4sd->prefixSize);
        else
            result = LZ4_decompress_safe_doubleDict(source, dest, compressedSize, maxOutputSize,
                                                    lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += (size_t)result;
        lz4sd->prefixEnd  += result;
    } else {
        /* The buffer wraps around, or they're switching to another buffer. */
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize,
                                                  lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = (size_t)result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}